

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_32sto3u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  int iVar1;
  OPJ_INT32 OVar2;
  int iVar3;
  OPJ_INT32 OVar4;
  ulong uVar5;
  sbyte sVar6;
  uint uVar7;
  byte *pbVar8;
  uint uVar9;
  
  uVar5 = 0;
  if ((length & 0xfffffffffffffff8) != 0) {
    do {
      uVar9 = pSrc[uVar5 + 2];
      iVar1 = pSrc[uVar5 + 3];
      OVar2 = pSrc[uVar5 + 4];
      uVar7 = pSrc[uVar5 + 5];
      iVar3 = pSrc[uVar5 + 6];
      OVar4 = pSrc[uVar5 + 7];
      *pDst = (byte)(uVar9 >> 1) | (byte)(pSrc[uVar5 + 1] << 2) | (byte)(pSrc[uVar5] << 5);
      pDst[1] = (byte)(uVar7 >> 2) | (char)OVar2 * '\x02' | (byte)(iVar1 << 4) | (byte)(uVar9 << 7);
      pDst[2] = (byte)(iVar3 << 3) | (byte)(uVar7 << 6) | (byte)OVar4;
      pDst = pDst + 3;
      uVar5 = uVar5 + 8;
    } while (uVar5 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    uVar9 = pSrc[uVar5];
    sVar6 = 5;
    uVar7 = (uint)(length & 7);
    pbVar8 = pDst;
    if (uVar7 != 1) {
      uVar9 = uVar9 << 3 | pSrc[uVar5 + 1];
      sVar6 = 2;
      if (2 < uVar7) {
        pbVar8 = pDst + 1;
        *pDst = (byte)((uint)pSrc[uVar5 + 2] >> 1) | (byte)(uVar9 << 2);
        uVar9 = pSrc[uVar5 + 2] & 1;
        sVar6 = 7;
        if (uVar7 != 3) {
          uVar9 = uVar9 << 3 | pSrc[uVar5 + 3];
          sVar6 = 4;
          if (4 < uVar7) {
            uVar9 = uVar9 << 3 | pSrc[uVar5 + 4];
            sVar6 = 1;
            if (uVar7 != 5) {
              pDst[1] = (byte)((uint)pSrc[uVar5 + 5] >> 2) | (char)uVar9 * '\x02';
              pbVar8 = pDst + 2;
              uVar9 = pSrc[uVar5 + 5] & 3;
              sVar6 = 6;
              if (uVar7 == 7) {
                uVar9 = uVar9 << 3 | pSrc[uVar5 + 6];
                sVar6 = 3;
              }
            }
          }
        }
      }
    }
    *pbVar8 = (byte)(uVar9 << sVar6);
  }
  return;
}

Assistant:

static void tif_32sto3u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                        OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;

    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];
        OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i + 4];
        OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i + 5];
        OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i + 6];
        OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i + 7];

        *pDst++ = (OPJ_BYTE)((src0 << 5) | (src1 << 2) | (src2 >> 1));
        *pDst++ = (OPJ_BYTE)((src2 << 7) | (src3 << 4) | (src4 << 1) | (src5 >> 2));
        *pDst++ = (OPJ_BYTE)((src5 << 6) | (src6 << 3) | (src7));
    }

    if (length & 7U) {
        unsigned int trailing = 0U;
        int remaining = 8U;
        length &= 7U;
        PUTBITS((OPJ_UINT32)pSrc[i + 0], 3)
        if (length > 1U) {
            PUTBITS((OPJ_UINT32)pSrc[i + 1], 3)
            if (length > 2U) {
                PUTBITS((OPJ_UINT32)pSrc[i + 2], 3)
                if (length > 3U) {
                    PUTBITS((OPJ_UINT32)pSrc[i + 3], 3)
                    if (length > 4U) {
                        PUTBITS((OPJ_UINT32)pSrc[i + 4], 3)
                        if (length > 5U) {
                            PUTBITS((OPJ_UINT32)pSrc[i + 5], 3)
                            if (length > 6U) {
                                PUTBITS((OPJ_UINT32)pSrc[i + 6], 3)
                            }
                        }
                    }
                }
            }
        }
        FLUSHBITS()
    }
}